

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sequence.hpp
# Opt level: O0

void __thiscall
biosoup::Sequence::Sequence
          (Sequence *this,char *name,uint32_t name_len,char *data,uint32_t data_len,char *quality,
          uint32_t quality_len)

{
  char *pcVar1;
  __int_type _Var2;
  ulong uVar3;
  allocator local_4e;
  allocator local_4d [20];
  allocator local_39;
  char *local_38;
  char *quality_local;
  char *pcStack_28;
  uint32_t data_len_local;
  char *data_local;
  char *pcStack_18;
  uint32_t name_len_local;
  char *name_local;
  Sequence *this_local;
  
  local_38 = quality;
  quality_local._4_4_ = data_len;
  pcStack_28 = data;
  data_local._4_4_ = name_len;
  pcStack_18 = name;
  name_local = (char *)this;
  _Var2 = std::__atomic_base<unsigned_int>::operator++
                    (&num_objects.super___atomic_base<unsigned_int>,0);
  pcVar1 = pcStack_18;
  this->id = _Var2;
  uVar3 = (ulong)data_local._4_4_;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&this->name,pcVar1,uVar3,&local_39);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  pcVar1 = pcStack_28;
  uVar3 = (ulong)quality_local._4_4_;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&this->data,pcVar1,uVar3,local_4d);
  std::allocator<char>::~allocator((allocator<char> *)local_4d);
  pcVar1 = local_38;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&this->quality,pcVar1,(ulong)quality_len,&local_4e);
  std::allocator<char>::~allocator((allocator<char> *)&local_4e);
  return;
}

Assistant:

Sequence(
      const char* name, std::uint32_t name_len,
      const char* data, std::uint32_t data_len,
      const char* quality, std::uint32_t quality_len)
      : id(num_objects++),
        name(name, name_len),
        data(data, data_len),
        quality(quality, quality_len) {}